

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemDecTiger.cpp
# Opt level: O2

void __thiscall ProblemDecTiger::ConstructObservations(ProblemDecTiger *this)

{
  uint AI;
  uint uVar1;
  string whatObs;
  string strAgentI;
  string strObsI;
  string descr;
  string name;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  ProblemDecTiger *local_250;
  MADPComponentDiscreteObservations *local_248;
  ulong local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  local_248 = &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_O;
  local_250 = this;
  for (AI = 0; (ulong)AI <
               (local_250->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
               super_MultiAgentDecisionProcess._m_nrAgents; AI = AI + 1) {
    local_240 = local_250->NUMBER_OF_OBSERVATIONS;
    uVar1 = 0;
    while( true ) {
      if (local_240 <= uVar1) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,"o",(allocator<char> *)local_1b8);
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      local_270._M_string_length = 0;
      local_290._M_string_length = 0;
      local_270.field_2._M_local_buf[0] = '\0';
      local_290.field_2._M_local_buf[0] = '\0';
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::operator>>((istream *)local_1b8,(string *)&local_290);
      std::__cxx11::string::append((string *)&local_218);
      std::ios::clear((int)*(undefined8 *)(local_1b8[0] + -0x18) + (int)(stringstream *)local_1b8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::operator>>((istream *)local_1b8,(string *)&local_270);
      std::__cxx11::string::append((string *)&local_218);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      local_2b0._M_string_length = 0;
      local_2b0.field_2._M_local_buf[0] = '\0';
      if (((ulong)uVar1 == 0) || (uVar1 == 1)) {
        std::__cxx11::string::assign((char *)&local_2b0);
      }
      std::operator+(&local_238,":",&local_2b0);
      std::__cxx11::string::append((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"Observation ",(allocator<char> *)&local_1f8);
      std::operator+(&local_1f8,&local_2b0," - #");
      std::__cxx11::string::append((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::operator+(&local_1d8,&local_270," of agent ");
      std::operator+(&local_1f8,&local_1d8,&local_290);
      std::__cxx11::string::append((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1d8);
      MADPComponentDiscreteObservations::AddObservation(local_248,AI,&local_218,&local_238);
      local_218._M_string_length = 0;
      *local_218._M_dataplus._M_p = '\0';
      local_270._M_string_length = 0;
      *local_270._M_dataplus._M_p = '\0';
      local_290._M_string_length = 0;
      *local_290._M_dataplus._M_p = '\0';
      local_2b0._M_string_length = 0;
      *local_2b0._M_dataplus._M_p = '\0';
      local_238._M_string_length = 0;
      *local_238._M_dataplus._M_p = '\0';
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::__cxx11::string::~string((string *)&local_218);
      uVar1 = uVar1 + 1;
    }
  }
  return;
}

Assistant:

void ProblemDecTiger::ConstructObservations()
{
    /// add observations:
    size_t nrJointObservations = 1;
    for(Index agentIndex=0; agentIndex < _m_nrAgents; agentIndex++)
    {
        size_t nrObservationsThisAgent = NUMBER_OF_OBSERVATIONS;
        nrJointObservations *= nrObservationsThisAgent;
    
//         _m_nrObservations.push_back(nrObservationsThisAgent);
//         vector<ObservationDiscrete> ov_temp;
        //Again, this is copied into _m_observationVecs, so no 'new' needed
//        _m_observationVecs.push_back( ov_temp );
        for(Index obsI=0; obsI < nrObservationsThisAgent; obsI++)
        {
            string name("o");
            stringstream ss;
            string strObsI, strAgentI;        
            ss << agentIndex;
            ss >> strAgentI;
            name += strAgentI;
            ss.clear();
            ss << obsI;
            ss >> strObsI;
            name += strObsI; 
            string whatObs;
            switch(obsI){
            case(HEARLEFT):    whatObs = "HearLeft";
                break;
            case(HEARRIGHT):whatObs = "HearRight";
                break;
            }
            name += ":" + whatObs;
            
            string descr("Observation ");
            descr += whatObs + " - #";
            descr += strObsI + " of agent " + strAgentI;
//             ObservationDiscrete od_temp = ObservationDiscrete(obsI,name,descr);
//             _m_observationVecs[agentIndex].push_back( od_temp );
            AddObservation(agentIndex,name,descr);
            name.clear(); 
            strObsI.clear(); 
            strAgentI.clear(); 
            whatObs.clear();
            descr.clear();
        }
    }
}